

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O2

Object<(anonymous_namespace)::RootPresets> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>
::BindPrivate(Object<(anonymous_namespace)::RootPresets> *this,string_view *name,
             MemberFunction *func,bool required)

{
  pointer *ppMVar1;
  undefined8 *puVar2;
  _Invoker_type p_Var3;
  pointer __first;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  pointer __result;
  pointer pMVar7;
  pointer pMVar8;
  ulong uVar9;
  _Tp_alloc_type *__alloc;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp;
  long lVar11;
  _func_ReadFileResult__Any_data_ptr_RootPresets_ptr_Value_ptr_ptr *__tmp_1;
  _Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
  *this_00;
  _Any_data local_88;
  _Manager_type *****local_78;
  _Invoker_type p_Stack_70;
  undefined1 local_68;
  _Any_data local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  _Manager_type ******ppppppp_Var10;
  
  sVar4 = name->_M_len;
  pcVar5 = name->_M_str;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  ppppppp_Var10 = (_Manager_type ******)(func->super__Function_base)._M_manager;
  p_Var3 = func->_M_invoker;
  if (ppppppp_Var10 != (_Manager_type ******)0x0) {
    local_58._M_unused._0_8_ = (undefined8)*(undefined8 *)&(func->super__Function_base)._M_functor;
    local_58._8_8_ = *(undefined8 *)((long)&(func->super__Function_base)._M_functor + 8);
    (func->super__Function_base)._M_manager = (_Manager_type)0x0;
    func->_M_invoker = (_Invoker_type)0x0;
  }
  local_88._M_unused._M_object = local_58._M_unused._M_object;
  local_88._8_8_ = local_58._8_8_;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_78 = (_Manager_type *****)ppppppp_Var10;
  p_Stack_70 = p_Var3;
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  pMVar8 = (this->Members).
           super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_68 = required;
  if (pMVar8 == (this->Members).
                super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __first = (this->Members).
              super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar11 = (long)pMVar8 - (long)__first;
    if (lVar11 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar6 = lVar11 / 0x38;
    uVar9 = 1;
    if (pMVar8 != __first) {
      uVar9 = uVar6;
    }
    this_00 = (_Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
               *)(uVar9 + uVar6);
    if ((_Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
         *)0x249249249249248 < this_00) {
      this_00 = (_Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
                 *)0x249249249249249;
    }
    if (CARRY8(uVar9,uVar6)) {
      this_00 = (_Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
                 *)0x249249249249249;
    }
    __result = std::
               _Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
               ::_M_allocate(this_00,(size_t)name);
    *(size_t *)((long)__result + lVar11) = sVar4;
    ((size_t *)((long)__result + lVar11))[1] = (size_t)pcVar5;
    puVar2 = (undefined8 *)((long)__result + lVar11 + 0x10);
    *puVar2 = 0;
    puVar2[1] = 0;
    *(undefined8 *)((long)__result + lVar11 + 0x20) = 0;
    *(_Invoker_type *)((long)__result + lVar11 + 0x28) = p_Stack_70;
    ppppppp_Var10 = (_Manager_type ******)local_78;
    if ((_Manager_type ******)local_78 != (_Manager_type ******)0x0) {
      *(void **)((long)__result + lVar11 + 0x10) = local_88._M_unused._M_object;
      *(undefined8 *)((long)__result + lVar11 + 0x18) = local_88._8_8_;
      *(_Manager_type ******)((long)__result + lVar11 + 0x20) = local_78;
      ppppppp_Var10 = &local_78;
      local_78 = (_Manager_type *****)0x0;
      p_Stack_70 = (_Invoker_type)0x0;
    }
    __alloc = (_Tp_alloc_type *)CONCAT71((int7)((ulong)ppppppp_Var10 >> 8),local_68);
    *(undefined1 *)((long)__result + lVar11 + 0x30) = local_68;
    pMVar7 = std::
             vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
             ::_S_relocate(__first,pMVar8,__result,__alloc);
    pMVar8 = std::
             vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
             ::_S_relocate(pMVar8,pMVar8,pMVar7 + 1,__alloc);
    lVar11 = (long)(this->Members).
                   super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first;
    std::
    _Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
    ::_M_deallocate((_Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
                     *)__first,(pointer)(lVar11 / 0x38),lVar11 % 0x38);
    (this->Members).
    super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->Members).
    super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar8;
    (this->Members).
    super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_00;
  }
  else {
    (pMVar8->Function).super__Function_base._M_manager = (_Manager_type)0x0;
    (pMVar8->Name)._M_len = sVar4;
    (pMVar8->Name)._M_str = pcVar5;
    *(undefined8 *)&(pMVar8->Function).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(pMVar8->Function).super__Function_base._M_functor + 8) = 0;
    (pMVar8->Function)._M_invoker = p_Var3;
    if (ppppppp_Var10 != (_Manager_type ******)0x0) {
      *(void **)&(pMVar8->Function).super__Function_base._M_functor = local_88._M_unused._M_object;
      *(undefined8 *)((long)&(pMVar8->Function).super__Function_base._M_functor + 8) =
           local_88._8_8_;
      (pMVar8->Function).super__Function_base._M_manager = (_Manager_type)ppppppp_Var10;
      local_78 = (_Manager_type *****)0x0;
      p_Stack_70 = (_Invoker_type)0x0;
    }
    pMVar8->Required = required;
    ppMVar1 = &(this->Members).
               super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  if (required) {
    this->AnyRequired = true;
  }
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  return this;
}

Assistant:

Object& BindPrivate(const cm::string_view& name, MemberFunction&& func,
                        bool required)
    {
      Member m;
      m.Name = name;
      m.Function = std::move(func);
      m.Required = required;
      this->Members.push_back(std::move(m));
      if (required) {
        this->AnyRequired = true;
      }
      return *this;
    }